

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::ImageAtomicOpCase::iterate(ImageAtomicOpCase *this)

{
  int iVar1;
  int iVar2;
  value_type vVar3;
  GLsizei GVar4;
  GLsizei GVar5;
  glUseProgramFunc p_Var6;
  glGetProgramResourceIndexFunc p_Var7;
  glBindBufferFunc p_Var8;
  glBindBufferBaseFunc p_Var9;
  glBindTextureFunc p_Var10;
  glTexStorage2DFunc p_Var11;
  glBindImageTextureFunc p_Var12;
  glDispatchComputeFunc p_Var13;
  glBindFramebufferFunc p_Var14;
  glFramebufferTexture2DFunc p_Var15;
  glReadPixelsFunc p_Var16;
  bool bVar17;
  ContextType CVar18;
  GLSLVersion version;
  ApiType requiredApiType;
  int iVar19;
  deUint32 dVar20;
  GLuint GVar21;
  deBool dVar22;
  GLenum GVar23;
  RenderContext *pRVar24;
  char *pcVar25;
  ostream *poVar26;
  int *piVar27;
  undefined4 extraout_var;
  ProgramSources *sources;
  TestLog *pTVar28;
  TestError *pTVar29;
  MessageBuilder *pMVar30;
  reference puVar31;
  size_type sVar32;
  reference pvVar33;
  void *pvVar34;
  GLuint *pGVar35;
  string local_708;
  allocator<char> local_6e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  int local_69c;
  int local_698;
  int offs;
  deUint32 ref;
  deUint32 res;
  int pixelNdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels;
  Framebuffer fbo;
  undefined1 local_650 [4];
  deUint32 ndx;
  BufferMemMap bufMap;
  InterfaceVariableInfo valueInfo;
  undefined1 local_5e0 [4];
  deUint32 valueIndex;
  InterfaceBlockInfo blockInfo;
  iterator iStack_590;
  deUint32 blockIndex;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_588;
  iterator i;
  allocator<unsigned_int> local_3f9;
  undefined1 local_3f8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputValues;
  Random rnd;
  ShaderSource local_3b0;
  ProgramSources local_388;
  undefined1 local_2b8 [8];
  ShaderProgram program;
  Texture outputTexture;
  Buffer inputBuffer;
  Functions *gl;
  ostringstream local_1a0 [8];
  ostringstream src;
  bool supportsES32;
  GLSLVersion glslVersion;
  ImageAtomicOpCase *this_local;
  Functions *gl_00;
  
  pRVar24 = Context::getRenderContext((this->super_TestCase).m_context);
  CVar18.super_ApiType.m_bits = (ApiType)(*pRVar24->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(CVar18);
  pRVar24 = Context::getRenderContext((this->super_TestCase).m_context);
  CVar18.super_ApiType.m_bits = (ApiType)(*pRVar24->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar17 = glu::contextSupports(CVar18,requiredApiType);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar25 = glu::getGLSLVersionDeclaration(version);
  poVar26 = std::operator<<((ostream *)local_1a0,pcVar25);
  poVar26 = std::operator<<(poVar26,"\n");
  pcVar25 = "#extension GL_OES_shader_image_atomic : require\n";
  if (bVar17) {
    pcVar25 = "\n";
  }
  poVar26 = std::operator<<(poVar26,pcVar25);
  poVar26 = std::operator<<(poVar26,"layout (local_size_x = ");
  poVar26 = (ostream *)std::ostream::operator<<(poVar26,this->m_localSize);
  poVar26 = std::operator<<(poVar26,") in;\n");
  poVar26 = std::operator<<(poVar26,"layout(r32ui, binding = 1) uniform highp uimage2D u_dstImg;\n")
  ;
  poVar26 = std::operator<<(poVar26,"buffer Input {\n");
  poVar26 = std::operator<<(poVar26,"    uint values[");
  piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
  iVar19 = *piVar27;
  piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
  poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar19 * *piVar27 * this->m_localSize);
  poVar26 = std::operator<<(poVar26,"];\n");
  poVar26 = std::operator<<(poVar26,"} sb_in;\n\n");
  poVar26 = std::operator<<(poVar26,"void main (void) {\n");
  poVar26 = std::operator<<(poVar26,"    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n");
  poVar26 = std::operator<<(poVar26,
                            "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
                           );
  poVar26 = std::operator<<(poVar26,"\n");
  poVar26 = std::operator<<(poVar26,"    if (gl_LocalInvocationIndex == 0u)\n");
  poVar26 = std::operator<<(poVar26,
                            "        imageStore(u_dstImg, ivec2(gl_WorkGroupID.xy), uvec4(0));\n");
  poVar26 = std::operator<<(poVar26,"    barrier();\n");
  poVar26 = std::operator<<(poVar26,
                            "    imageAtomicAdd(u_dstImg, ivec2(gl_WorkGroupID.xy), value);\n");
  std::operator<<(poVar26,"}\n");
  pRVar24 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar19 = (*pRVar24->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar19);
  pRVar24 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&outputTexture.super_ObjectWrapper.m_object,
             pRVar24);
  pRVar24 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&program.m_program.m_info.linkTimeUs,pRVar24)
  ;
  pRVar24 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_388);
  std::__cxx11::ostringstream::str();
  glu::ShaderSource::ShaderSource(&local_3b0,SHADERTYPE_COMPUTE,(string *)&rnd.m_rnd.z);
  sources = glu::ProgramSources::operator<<(&local_388,&local_3b0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2b8,pRVar24,sources);
  glu::ShaderSource::~ShaderSource(&local_3b0);
  std::__cxx11::string::~string((string *)&rnd.m_rnd.z);
  glu::ProgramSources::~ProgramSources(&local_388);
  de::Random::Random((Random *)
                     &inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,0x77238ac2);
  piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
  iVar19 = *piVar27;
  piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
  iVar1 = *piVar27;
  iVar2 = this->m_localSize;
  std::allocator<unsigned_int>::allocator(&local_3f9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f8,
             (long)(iVar19 * iVar1 * iVar2),&local_3f9);
  std::allocator<unsigned_int>::~allocator(&local_3f9);
  pTVar28 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  glu::operator<<(pTVar28,(ShaderProgram *)local_2b8);
  bVar17 = glu::ShaderProgram::isOk((ShaderProgram *)local_2b8);
  if (!bVar17) {
    pTVar29 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar29,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x500);
    __cxa_throw(pTVar29,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar28 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<((MessageBuilder *)&i,pTVar28,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar30 = tcu::MessageBuilder::operator<<((MessageBuilder *)&i,(char (*) [14])"Work groups: ");
  pMVar30 = tcu::MessageBuilder::operator<<(pMVar30,&this->m_imageSize);
  tcu::MessageBuilder::operator<<(pMVar30,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i);
  p_Var6 = gl_00->useProgram;
  dVar20 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b8);
  (*p_Var6)(dVar20);
  local_588._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f8);
  while( true ) {
    iStack_590 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f8);
    bVar17 = __gnu_cxx::operator!=(&local_588,&stack0xfffffffffffffa70);
    if (!bVar17) break;
    dVar20 = de::Random::getUint32
                       ((Random *)
                        &inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar31 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_588);
    *puVar31 = dVar20;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_588);
  }
  p_Var7 = gl_00->getProgramResourceIndex;
  dVar20 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b8);
  blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (*p_Var7)(dVar20,0x92e6,"Input");
  dVar20 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b8);
  glu::getProgramInterfaceBlockInfo
            ((InterfaceBlockInfo *)local_5e0,gl_00,dVar20,0x92e6,
             blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  p_Var7 = gl_00->getProgramResourceIndex;
  dVar20 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b8);
  GVar21 = (*p_Var7)(dVar20,0x92e5,"Input.values");
  dVar20 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b8);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&bufMap.m_ptr,gl_00,dVar20,0x92e5,GVar21);
  p_Var8 = gl_00->bindBuffer;
  dVar20 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&outputTexture.super_ObjectWrapper.m_object);
  (*p_Var8)(0x90d2,dVar20);
  (*gl_00->bufferData)(0x90d2,(ulong)blockInfo.index,(void *)0x0,0x88e4);
  do {
    dVar22 = ::deGetFalse();
    if (dVar22 != 0) {
LAB_00a36cff:
      pTVar29 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar29,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                 ,0x514);
      __cxa_throw(pTVar29,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    sVar32 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f8);
    if (valueInfo.atomicCounterBufferIndex != (deUint32)sVar32) goto LAB_00a36cff;
    dVar22 = ::deGetFalse();
  } while (dVar22 != 0);
  BufferMemMap::BufferMemMap((BufferMemMap *)local_650,gl_00,0x90d2,0,blockInfo.index,2);
  fbo.super_ObjectWrapper._20_4_ = 0;
  while( true ) {
    sVar32 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f8);
    if ((uint)sVar32 <= (uint)fbo.super_ObjectWrapper._20_4_) break;
    pvVar33 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f8,
                         (ulong)(uint)fbo.super_ObjectWrapper._20_4_);
    vVar3 = *pvVar33;
    pvVar34 = BufferMemMap::getPtr((BufferMemMap *)local_650);
    *(value_type *)
     ((long)pvVar34 +
     (ulong)(fbo.super_ObjectWrapper._20_4_ * valueInfo.arraySize) + (ulong)valueInfo.type) = vVar3;
    fbo.super_ObjectWrapper._20_4_ = fbo.super_ObjectWrapper._20_4_ + 1;
  }
  BufferMemMap::~BufferMemMap((BufferMemMap *)local_650);
  p_Var9 = gl_00->bindBufferBase;
  dVar20 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&outputTexture.super_ObjectWrapper.m_object);
  (*p_Var9)(0x90d2,blockInfo.name.field_2._12_4_,dVar20);
  GVar23 = (*gl_00->getError)();
  glu::checkError(GVar23,"Input buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x51e);
  glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&bufMap.m_ptr);
  glu::InterfaceBlockInfo::~InterfaceBlockInfo((InterfaceBlockInfo *)local_5e0);
  p_Var10 = gl_00->bindTexture;
  dVar20 = glu::ObjectWrapper::operator*((ObjectWrapper *)&program.m_program.m_info.linkTimeUs);
  (*p_Var10)(0xde1,dVar20);
  p_Var11 = gl_00->texStorage2D;
  piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
  GVar4 = *piVar27;
  piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
  (*p_Var11)(0xde1,1,0x8236,GVar4,*piVar27);
  (*gl_00->texParameteri)(0xde1,0x2801,0x2600);
  (*gl_00->texParameteri)(0xde1,0x2800,0x2600);
  GVar23 = (*gl_00->getError)();
  glu::checkError(GVar23,"Uploading image data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x526);
  p_Var12 = gl_00->bindImageTexture;
  dVar20 = glu::ObjectWrapper::operator*((ObjectWrapper *)&program.m_program.m_info.linkTimeUs);
  (*p_Var12)(1,dVar20,0,'\0',0,0x88ba,0x8236);
  GVar23 = (*gl_00->getError)();
  glu::checkError(GVar23,"Image setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x52a);
  p_Var13 = gl_00->dispatchCompute;
  pGVar35 = (GLuint *)tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
  GVar21 = *pGVar35;
  pGVar35 = (GLuint *)tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
  (*p_Var13)(GVar21,*pGVar35,1);
  GVar23 = (*gl_00->getError)();
  glu::checkError(GVar23,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x52e);
  pRVar24 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)
             &pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pRVar24);
  piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
  iVar19 = *piVar27;
  piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
  iVar1 = *piVar27;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&res + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixelNdx,
             (long)(iVar19 * iVar1 * 4),(allocator<unsigned_int> *)((long)&res + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&res + 3));
  p_Var14 = gl_00->bindFramebuffer;
  dVar20 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)
                      &pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*p_Var14)(0x8d40,dVar20);
  p_Var15 = gl_00->framebufferTexture2D;
  dVar20 = glu::ObjectWrapper::operator*((ObjectWrapper *)&program.m_program.m_info.linkTimeUs);
  (*p_Var15)(0x8d40,0x8ce0,0xde1,dVar20,0);
  while( true ) {
    dVar22 = ::deGetFalse();
    if (dVar22 != 0) break;
    GVar23 = (*gl_00->checkFramebufferStatus)(0x8d40);
    if (GVar23 != 0x8cd5) break;
    dVar22 = ::deGetFalse();
    if (dVar22 == 0) {
      (*gl_00->readBuffer)(0x8ce0);
      p_Var16 = gl_00->readPixels;
      piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,0);
      GVar4 = *piVar27;
      piVar27 = tcu::Vector<int,_2>::operator[](&this->m_imageSize,1);
      GVar5 = *piVar27;
      pvVar33 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixelNdx,0);
      (*p_Var16)(0,0,GVar4,GVar5,0x8d99,0x1405,pvVar33);
      GVar23 = (*gl_00->getError)();
      glu::checkError(GVar23,"Reading pixels failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                      ,0x53c);
      ref = 0;
      while( true ) {
        dVar20 = ref;
        sVar32 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f8);
        if ((int)((long)((ulong)(uint)((int)sVar32 >> 0x1f) << 0x20 | sVar32 & 0xffffffff) /
                 (long)this->m_localSize) <= (int)dVar20) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixelNdx);
          glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)3> *)
                     &pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f8);
          de::Random::~Random((Random *)
                              &inputValues.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2b8);
          glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)0> *)&program.m_program.m_info.linkTimeUs)
          ;
          glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)1> *)
                     &outputTexture.super_ObjectWrapper.m_object);
          std::__cxx11::ostringstream::~ostringstream(local_1a0);
          return STOP;
        }
        pvVar33 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixelNdx,
                             (long)(int)(ref << 2));
        offs = *pvVar33;
        local_698 = 0;
        for (local_69c = 0; local_69c < this->m_localSize; local_69c = local_69c + 1) {
          pvVar33 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3f8,
                               (long)(int)(ref * this->m_localSize + local_69c));
          local_698 = *pvVar33 + local_698;
        }
        if (offs != local_698) break;
        ref = ref + 1;
      }
      pTVar29 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e0,"Comparison failed for pixel ",&local_6e1);
      de::toString<int>(&local_708,(int *)&ref);
      std::operator+(&local_6c0,&local_6e0,&local_708);
      tcu::TestError::TestError(pTVar29,&local_6c0);
      __cxa_throw(pTVar29,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar29 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar29,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x537);
  __cxa_throw(pTVar29,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		const bool					supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< (supportsES32 ? "\n" : "#extension GL_OES_shader_image_atomic : require\n")
			<< "layout (local_size_x = " << m_localSize << ") in;\n"
			<< "layout(r32ui, binding = 1) uniform highp uimage2D u_dstImg;\n"
			<< "buffer Input {\n"
			<< "    uint values[" << (m_imageSize[0]*m_imageSize[1]*m_localSize) << "];\n"
			<< "} sb_in;\n\n"
			<< "void main (void) {\n"
			<< "    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
			<< "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
			<< "\n"
			<< "    if (gl_LocalInvocationIndex == 0u)\n"
			<< "        imageStore(u_dstImg, ivec2(gl_WorkGroupID.xy), uvec4(0));\n"
			<< "    barrier();\n"
			<< "    imageAtomicAdd(u_dstImg, ivec2(gl_WorkGroupID.xy), value);\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				inputBuffer		(m_context.getRenderContext());
		const Texture				outputTexture	(m_context.getRenderContext());
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));
		de::Random					rnd				(0x77238ac2);
		vector<deUint32>			inputValues		(m_imageSize[0]*m_imageSize[1]*m_localSize);

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_imageSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Input values
		for (vector<deUint32>::iterator i = inputValues.begin(); i != inputValues.end(); ++i)
			*i = rnd.getUint32();

		// Input buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Input");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Input.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)blockInfo.dataSize, DE_NULL, GL_STATIC_DRAW);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, (int)blockInfo.dataSize, GL_MAP_WRITE_BIT);

				for (deUint32 ndx = 0; ndx < (deUint32)inputValues.size(); ndx++)
					*(deUint32*)((deUint8*)bufMap.getPtr() + valueInfo.offset + ndx*valueInfo.arrayStride) = inputValues[ndx];
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, blockInfo.bufferBinding, *inputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Input buffer setup failed");
		}

		// Output image setup
		gl.bindTexture(GL_TEXTURE_2D, *outputTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_imageSize[0], m_imageSize[1]);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading image data failed");

		// Bind to unit 1
		gl.bindImageTexture(1, *outputTexture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Image setup failed");

		// Dispatch compute workload
		gl.dispatchCompute(m_imageSize[0], m_imageSize[1], 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			Framebuffer			fbo			(m_context.getRenderContext());
			vector<deUint32>	pixels		(m_imageSize[0]*m_imageSize[1]*4);

			gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
			gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *outputTexture, 0);
			TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

			// \note In ES3 we have to use GL_RGBA_INTEGER
			gl.readBuffer(GL_COLOR_ATTACHMENT0);
			gl.readPixels(0, 0, m_imageSize[0], m_imageSize[1], GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

			for (int pixelNdx = 0; pixelNdx < (int)inputValues.size()/m_localSize; pixelNdx++)
			{
				const deUint32	res		= pixels[pixelNdx*4];
				deUint32		ref		= 0;

				for (int offs = 0; offs < m_localSize; offs++)
					ref += inputValues[pixelNdx*m_localSize + offs];

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for pixel ") + de::toString(pixelNdx));
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}